

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O1

void __thiscall
priorityQueueTest_random_large_Test::TestBody(priorityQueueTest_random_large_Test *this)

{
  bool bVar1;
  T *pTVar2;
  int iVar3;
  char *pcVar4;
  double dVar5;
  double num;
  priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_> std_pq;
  Priority_queue pq;
  default_random_engine e;
  random_device rand_dev;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1428;
  AssertHelper local_1420;
  double local_1418;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1410;
  priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
  local_1408;
  double local_13e0;
  Priority_queue local_13d8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13b8;
  random_device local_13b0;
  
  std::random_device::random_device(&local_13b0);
  local_13b8._M_x = 0x32a;
  local_1408.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_1408.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1408.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_13d8.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_13d8._20_8_ = 0;
  local_13d8.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13d8.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_13d8.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  iVar3 = 5000000;
  do {
    dVar5 = std::
            generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                      (&local_13b8);
    local_1418 = dVar5 * 100.0 + 0.0;
    std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
    push(&local_1408,&local_1418);
    Priority_queue::push(&local_13d8,&local_1418);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  local_13e0 = *local_1408.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  pTVar2 = Priority_queue::top(&local_13d8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_1418,"std_pq.top()","pq.top()",local_13e0,*pTVar2);
  if (local_1418._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1428);
    if (local_1410.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_1410.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1420,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
               ,0x35,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1420,(Message *)&local_1428);
    testing::internal::AssertHelper::~AssertHelper(&local_1420);
    if (local_1428.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_1428.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1428.ptr_ + 8))();
      }
      local_1428.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1410,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1410,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1428.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)local_1408.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1408.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3);
    local_1420.data_ = (AssertHelperData *)Priority_queue::size(&local_13d8);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_1418,"std_pq.size()","pq.size()",(unsigned_long *)&local_1428,
               (unsigned_long *)&local_1420);
    if (local_1418._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1428);
      if (local_1410.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_1410.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1420,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                 ,0x36,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1420,(Message *)&local_1428);
      testing::internal::AssertHelper::~AssertHelper(&local_1420);
      if (local_1428.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_1428.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1428.ptr_ + 8))();
        }
        local_1428.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1410,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  Priority_queue::~Priority_queue(&local_13d8);
  if (local_1408.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (double *)0x0) {
    operator_delete(local_1408.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1408.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1408.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

TEST_F(priorityQueueTest,random_large) {
    std::random_device rand_dev;

    std::default_random_engine e(810);
    std::uniform_real_distribution<double> dis(0, 100);

    std::priority_queue<double> std_pq;
    Priority_queue pq;

    for (unsigned i = 0; i != 5000000; ++i) {
        double num = dis(e);
        std_pq.push(num);
        pq.push(num);
    }
    ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
    ASSERT_EQ(std_pq.size(), pq.size());
}